

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx_locks.c
# Opt level: O1

void * rec_del(pfx_table *pfxt)

{
  __pid_t _Var1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  long in_FS_OFFSET;
  pfx_record rec;
  pfx_record local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1 = getpid();
  local_60.min_len = ' ';
  local_60.max_len = ' ';
  local_60.prefix._0_8_ = 0;
  puts("removing records");
  if (min_i <= max_i) {
    uVar4 = max_i;
    do {
      local_60.socket = (rtr_socket *)0x0;
      local_60.min_len = ' ';
      local_60.max_len = ' ';
      uVar3 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      local_60.prefix._0_8_ = (ulong)uVar3 << 0x20;
      local_60.asn = _Var1 % 2;
      pfx_table_remove(pfxt,&local_60);
      local_60.asn = _Var1 % 2 + 1;
      pfx_table_remove(pfxt,&local_60);
      local_60.min_len = 0x80;
      local_60.max_len = 0x80;
      local_60.prefix.u.addr6.addr[1] = min_i - 1;
      local_60.prefix.u.addr6.addr[0] = uVar3 - 1;
      local_60.prefix.ver = LRTR_IPV6;
      pfx_table_remove(pfxt,&local_60);
      iVar2 = rand();
      usleep(iVar2 / 0x6666666);
      uVar4 = uVar4 - 1;
    } while (min_i <= uVar4);
  }
  puts("Done");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (void *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static void *rec_del(struct pfx_table *pfxt)
{
	const int tid = getpid();
	struct pfx_record rec;

	rec.min_len = 32;
	rec.max_len = 32;
	rec.prefix.ver = LRTR_IPV4;
	rec.prefix.u.addr4.addr = 0;
	printf("removing records\n");
	for (uint32_t i = max_i; i >= min_i; i--) {
		rec.socket = NULL;
		rec.min_len = 32;
		rec.max_len = 32;
		rec.asn = tid % 2;
		rec.prefix.ver = LRTR_IPV4;
		rec.prefix.u.addr4.addr = htonl(i);
		pfx_table_remove(pfxt, &rec);
		rec.asn = (tid % 2) + 1;
		pfx_table_remove(pfxt, &rec);

		rec.prefix.ver = LRTR_IPV6;
		rec.min_len = 128;
		rec.max_len = 128;
		rec.prefix.u.addr6.addr[1] = min_i + 0xFFFFFFFF;
		rec.prefix.u.addr6.addr[0] = htonl(i) + 0xFFFFFFFF;

		pfx_table_remove(pfxt, &rec);
		usleep(rand() / (RAND_MAX / 20));
	}
	printf("Done\n");

	return NULL;
}